

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflectance.cpp
# Opt level: O2

double phyr::frDielectric(double cosThetaI,double etaI,double etaT)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  
  dVar3 = -1.0;
  if (-1.0 <= cosThetaI) {
    dVar3 = cosThetaI;
  }
  dVar1 = 1.0;
  dVar2 = 1.0;
  if (dVar3 <= 1.0) {
    dVar2 = dVar3;
  }
  dVar4 = (double)(~-(ulong)(0.0 < dVar2) & (ulong)etaI | -(ulong)(0.0 < dVar2) & (ulong)etaT);
  if (dVar2 <= 0.0) {
    dVar2 = (double)(-(ulong)(cosThetaI < -1.0) & 0x3ff0000000000000 |
                    ~-(ulong)(cosThetaI < -1.0) &
                    (~-(ulong)(1.0 < dVar3) & (ulong)ABS(cosThetaI) |
                    -(ulong)(1.0 < dVar3) & 0x3ff0000000000000));
    etaI = etaT;
  }
  dVar3 = 1.0 - dVar2 * dVar2;
  if (dVar3 <= 0.0) {
    dVar3 = 0.0;
  }
  dVar3 = (SQRT(dVar3) * etaI) / dVar4;
  if (dVar3 < 1.0) {
    dVar3 = 1.0 - dVar3 * dVar3;
    if (dVar3 <= 0.0) {
      dVar3 = 0.0;
    }
    dVar1 = etaI * SQRT(dVar3);
    dVar1 = (dVar4 * dVar2 - dVar1) / (dVar4 * dVar2 + dVar1);
    dVar4 = dVar4 * SQRT(dVar3);
    dVar3 = (etaI * dVar2 - dVar4) / (etaI * dVar2 + dVar4);
    dVar1 = (dVar1 * dVar1 + dVar3 * dVar3) * 0.5;
  }
  return dVar1;
}

Assistant:

Real frDielectric(Real cosThetaI, Real etaI, Real etaT) {
    // Make sure cosThetaI is within expected range
    cosThetaI = clamp(cosThetaI, -1, 1);

    // Potentially swap indices of refraction.
    // If {cosThetaI} is between 0 and 1, the ray is entering
    // the medium and it's exiting the medium if the value is
    // between -1 and 0, which is when we need to swap the eta values.
    bool rayEntering = cosThetaI > 0;
    if (!rayEntering) {
        std::swap(etaI, etaT);
        cosThetaI = std::abs(cosThetaI);
    }

    // Compute {cosThetaT} using Snell's law
    Real sinThetaI = std::sqrt(std::max(Real(0), 1 - cosThetaI * cosThetaI));
    Real sinThetaT = etaI * sinThetaI / etaT;

    // No fresnel effect on total internal reflection
    if (sinThetaT >= 1) return 1;
    Real cosThetaT = std::sqrt(std::max(Real(0), 1 - sinThetaT * sinThetaT));

    // Apply the fresnel reflectance formulae for dielectrics
    Real rParl = ((etaT * cosThetaI) - (etaI * cosThetaT)) /
                 ((etaT * cosThetaI) + (etaI * cosThetaT));
    Real rPerp = ((etaI * cosThetaI) - (etaT * cosThetaT)) /
                 ((etaI * cosThetaI) + (etaT * cosThetaT));

    return (rParl * rParl + rPerp * rPerp) * 0.5;
}